

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::IsBufferExecuteReadOnly
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation)

{
  SIZE_T SVar1;
  bool local_71;
  size_t resultBytes;
  MEMORY_BASIC_INFORMATION memBasicInfo;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  TEmitBufferAllocation *allocation_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
  *this_local;
  
  AutoRealOrFakeCriticalSection<CriticalSection>::AutoRealOrFakeCriticalSection
            ((AutoRealOrFakeCriticalSection<CriticalSection> *)&memBasicInfo.Type,
             &this->criticalSection);
  SVar1 = VirtualQuery(allocation->allocation->address,(PMEMORY_BASIC_INFORMATION)&resultBytes,0x30)
  ;
  local_71 = SVar1 != 0 && memBasicInfo.RegionSize._4_4_ == 0x20;
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection
            ((AutoRealOrFakeCriticalSection<CriticalSection> *)&memBasicInfo.Type);
  return local_71;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::IsBufferExecuteReadOnly(TEmitBufferAllocation * allocation)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);
    MEMORY_BASIC_INFORMATION memBasicInfo;
    size_t resultBytes = VirtualQuery(allocation->allocation->address, &memBasicInfo, sizeof(memBasicInfo));
    return resultBytes != 0 && memBasicInfo.Protect == PAGE_EXECUTE_READ;
}